

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O2

int cpu_exec_sparc64(uc_struct_conflict9 *uc,CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUClass *pCVar3;
  ulong pc;
  target_ulong cs_base;
  TranslationBlock *pTVar4;
  long lVar5;
  CPUWatchpoint *pCVar6;
  _Bool _Var7;
  char cVar8;
  int iVar9;
  uint uVar10;
  tcg_target_ulong tVar11;
  TranslationBlock *pTVar12;
  uint uVar13;
  long lVar14;
  list_item *plVar15;
  anon_union_16_2_aaf24f3d_for_entry *paVar16;
  uint uVar17;
  uint cf_mask;
  TranslationBlock *pTVar18;
  CPUClass *pCVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  TranslationBlock *pTStack_80;
  target_ulong local_50;
  undefined4 local_48;
  target_ulong local_40;
  undefined4 local_38;
  
  pCVar19 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar19->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var7 = (*pCVar19->has_work)((CPUState_conflict *)cpu);
    if (!_Var7) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar19->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar9 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar9 != 0) {
    pCVar19 = cpu->cc;
  }
LAB_008fbce0:
  puVar1 = cpu->uc;
  uVar13 = cpu->exception_index;
  if (puVar1->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var7 = (*puVar1->stop_interrupt)(puVar1,uVar13);
    if (_Var7) {
      plVar15 = (list_item *)(puVar1->hook + 0xe);
      goto LAB_008fc1e8;
    }
    uVar13 = cpu->exception_index;
  }
  if (-1 < (int)uVar13) {
    if (0xffff < uVar13) {
      if (uVar13 == 0x10002) {
        pCVar3 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          paVar16 = (anon_union_16_2_aaf24f3d_for_entry *)&cpu->watchpoints;
          while (pCVar6 = paVar16->tqe_next, pCVar6 != (CPUWatchpoint *)0x0) {
            *(byte *)&pCVar6->flags = (byte)pCVar6->flags & 0x3f;
            paVar16 = &pCVar6->entry;
          }
        }
        (*pCVar3->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_008fc26e;
    }
    plVar15 = (list_item *)puVar1->hook;
    bVar20 = false;
    while ((plVar15 = plVar15->next, plVar15 != (list_item *)0x0 &&
           (pvVar2 = plVar15->data, pvVar2 != (void *)0x0))) {
      if (*(char *)((long)pvVar2 + 0x14) == '\0') {
        (**(code **)((long)pvVar2 + 0x28))
                  (puVar1,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
        bVar20 = true;
      }
    }
    if (!bVar20) goto LAB_008fc242;
    cpu->exception_index = -1;
  }
  pTStack_80 = (TranslationBlock *)0x0;
  pTVar18 = pTStack_80;
  while( true ) {
    pCVar3 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0xf9a) = 0;
    uVar13 = cpu->interrupt_request;
    if (uVar13 != 0) {
      uVar17 = uVar13;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar17 = uVar13 & 0xffffeda5;
      }
      if ((char)uVar17 < '\0') {
        cpu->interrupt_request = uVar13 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_008fbce0;
      }
      if ((uVar17 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_008fbce0;
      }
      _Var7 = (*pCVar3->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar17);
      if (_Var7) {
        cpu->exception_index = -1;
        pTVar18 = (TranslationBlock *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar18 = (TranslationBlock *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    uVar13 = cpu->cflags_next_tb;
    if (uVar13 == 0xffffffff) {
      uVar13 = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    pvVar2 = cpu->env_ptr;
    pc = *(ulong *)((long)pvVar2 + 0x48);
    cs_base = *(target_ulong *)((long)pvVar2 + 0x50);
    uVar17 = 5;
    if (((*(byte *)((long)pvVar2 + 0x1208) & 8) != 0) &&
       ((((*(uint *)((long)pvVar2 + 0x20b0) >> 0xb & 1) == 0 ||
         ((*(byte *)((long)pvVar2 + 0x1fa0) & 4) == 0)) &&
        (uVar17 = 4, *(int *)((long)pvVar2 + 0x1c4c) == 0)))) {
      uVar17 = *(uint *)((long)pvVar2 + 0x1c48) >> 1 & 2;
    }
    uVar10 = *(uint *)((long)pvVar2 + 0x1c48);
    uVar17 = ((uVar10 & 4) << 4 | uVar17) + (uVar10 & 8) * 4;
    if ((uVar10 & 0x10) != 0 && (*(uint *)((long)pvVar2 + 0x20b0) & 1) != 0) {
      uVar17 = uVar17 + (*(uint *)((long)pvVar2 + 0x1f68) & 4) * 4;
    }
    puVar1 = cpu->uc;
    uVar17 = *(int *)((long)pvVar2 + 0x1c44) << 0x18 | uVar17;
    uVar10 = (uint)(pc >> 7) ^ (uint)pc;
    uVar10 = uVar10 & 0x3f | uVar10 >> 7 & 0xfc0;
    pTVar12 = cpu->tb_jmp_cache[uVar10];
    cf_mask = cpu->cluster_index << 0x18 | uVar13 & 0xffffff;
    if ((((pTVar12 == (TranslationBlock *)0x0) || (pTVar12->pc != pc)) ||
        ((pTVar12->cs_base != cs_base ||
         ((pTVar12->flags != uVar17 || (cpu->trace_dstate[0] != (ulong)pTVar12->trace_vcpu_dstate)))
         ))) || ((pTVar12->cflags & 0xff0effff) != cf_mask)) {
      pTVar12 = tb_htable_lookup_sparc64(cpu,pc,cs_base,uVar17,cf_mask);
      if (pTVar12 == (TranslationBlock *)0x0) {
        pTVar12 = tb_gen_code_sparc64(cpu,pc,cs_base,uVar17,uVar13);
        cpu->tb_jmp_cache[uVar10] = pTVar12;
        pTVar4 = puVar1->last_tb;
        if (pTVar4 != (TranslationBlock *)0x0) {
          local_40 = pTVar12->pc;
          uVar13._0_2_ = pTVar12->size;
          uVar13._2_2_ = pTVar12->icount;
          auVar21 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0xe1);
          local_38 = auVar21._0_4_;
          local_50 = pTVar4->pc;
          uVar17._0_2_ = pTVar4->size;
          uVar17._2_2_ = pTVar4->icount;
          auVar21 = pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),0xe1);
          local_48 = auVar21._0_4_;
          plVar15 = (list_item *)(puVar1->hook + 0xf);
          while ((plVar15 = plVar15->next, plVar15 != (list_item *)0x0 &&
                 (pvVar2 = plVar15->data, pvVar2 != (void *)0x0))) {
            if (*(char *)((long)pvVar2 + 0x14) == '\0') {
              if ((*(ulong *)((long)pvVar2 + 0x18) <= pTVar12->pc &&
                   pTVar12->pc <= *(ulong *)((long)pvVar2 + 0x20)) ||
                 (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) {
                (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
              }
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar10] = pTVar12;
      }
    }
    if ((pTVar18 != (TranslationBlock *)0x0) && (pTVar12->page_addr[1] == 0xffffffffffffffff)) {
      if (1 < (uint)pTStack_80) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar12->cflags & 0x40000) == 0) {
        LOCK();
        bVar20 = pTVar18->jmp_dest[(long)pTStack_80] == 0;
        if (bVar20) {
          pTVar18->jmp_dest[(long)pTStack_80] = (uintptr_t)pTVar12;
        }
        UNLOCK();
        if (bVar20) {
          pvVar2 = (pTVar18->tc).ptr;
          *(int *)(pTVar18->jmp_target_arg[(long)pTStack_80] + (long)pvVar2) =
               (*(int *)&(pTVar12->tc).ptr -
               ((int)pTVar18->jmp_target_arg[(long)pTStack_80] + (int)pvVar2)) + -4;
          pTVar18->jmp_list_next[(long)pTStack_80] = pTVar12->jmp_list_head;
          pTVar12->jmp_list_head = (ulong)pTVar18 | (ulong)pTStack_80;
        }
      }
    }
    if (cpu->exit_request == false) {
      tVar11 = cpu_tb_exec(cpu,pTVar12);
      cpu->uc->last_tb = pTVar12;
      pTVar12 = (TranslationBlock *)(tVar11 & 0xfffffffffffffffc);
      uVar13 = (uint)tVar11 & 3;
      pTStack_80 = (TranslationBlock *)(ulong)uVar13;
      pTVar18 = pTVar12;
      if (uVar13 == 3) {
        pTVar18 = (TranslationBlock *)0x0;
        pTStack_80 = (TranslationBlock *)0x3;
        if (-1 < *(int *)(cpu[1].tb_jmp_cache + 499)) {
          lVar5 = cpu->icount_budget;
          lVar14 = 0xffff;
          if (lVar5 < 0xffff) {
            lVar14 = lVar5;
          }
          uVar13 = (uint)lVar14;
          *(short *)(cpu[1].tb_jmp_cache + 499) = (short)lVar14;
          cpu->icount_extra = lVar5 - (int)uVar13;
          pTVar18 = (TranslationBlock *)0x0;
          pTStack_80 = (TranslationBlock *)0x3;
          if (0 < (int)uVar13 && lVar5 - (int)uVar13 == 0) {
            uVar17 = 0x7fff;
            if (uVar13 < 0x7fff) {
              uVar17 = uVar13;
            }
            pTVar18 = tb_gen_code_sparc64(cpu,pTVar12->pc,pTVar12->cs_base,pTVar12->flags,
                                          uVar17 | 0x10000);
            pTVar18->orig_tb = pTVar12;
            cpu_tb_exec(cpu,pTVar18);
            tb_phys_invalidate_sparc64
                      ((TCGContext_conflict8 *)cpu->uc->tcg_ctx,pTVar18,0xffffffffffffffff);
            tcg_tb_remove_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx,pTVar18);
            pTVar18 = (TranslationBlock *)0x0;
            pTStack_80 = (TranslationBlock *)0x3;
          }
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_008fbce0;
LAB_008fc242:
  puVar1->invalid_error = 0x15;
  cpu->halted = 1;
  goto LAB_008fc264;
  while ((*(char *)((long)pvVar2 + 0x14) != '\0' ||
         (cVar8 = (**(code **)((long)pvVar2 + 0x28))(puVar1,*(undefined8 *)((long)pvVar2 + 0x30)),
         cVar8 == '\0'))) {
LAB_008fc1e8:
    plVar15 = plVar15->next;
    if ((plVar15 == (list_item *)0x0) || (pvVar2 = plVar15->data, pvVar2 == (void *)0x0)) {
      puVar1->invalid_error = 10;
      break;
    }
  }
LAB_008fc264:
  uVar13 = 0x10001;
LAB_008fc26e:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar19->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar13;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}